

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# numeric.cpp
# Opt level: O1

unique_ptr<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>,_true> __thiscall
duckdb::BindGenericRoundFunctionDecimal<duckdb::FloorDecimalOperator>
          (duckdb *this,ClientContext *context,ScalarFunction *bound_function,
          vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
          *arguments)

{
  LogicalType *type;
  PhysicalType PVar1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  element_type *peVar2;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var3;
  uint8_t uVar4;
  reference this_01;
  pointer pEVar5;
  reference pvVar6;
  code *__f;
  undefined4 uVar7;
  undefined4 uVar8;
  undefined4 uVar9;
  undefined4 uVar10;
  uint8_t in_stack_ffffffffffffff9d;
  uint8_t in_stack_ffffffffffffff9e;
  LogicalType local_60;
  undefined4 local_48;
  undefined4 uStack_44;
  undefined4 uStack_40;
  undefined4 uStack_3c;
  
  this_01 = vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
            ::operator[](arguments,0);
  pEVar5 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::operator->
                     (this_01);
  type = &pEVar5->return_type;
  uVar4 = DecimalType::GetScale(type);
  DecimalType::GetWidth(type);
  if (uVar4 == '\0') {
    __f = ScalarFunction::NopFunction;
  }
  else {
    PVar1 = (pEVar5->return_type).physical_type_;
    if (PVar1 == INT64) {
      __f = GenericRoundFunctionDecimal<long,duckdb::NumericHelper,duckdb::FloorDecimalOperator>;
    }
    else if (PVar1 == INT32) {
      __f = GenericRoundFunctionDecimal<int,duckdb::NumericHelper,duckdb::FloorDecimalOperator>;
    }
    else if (PVar1 == INT16) {
      __f = GenericRoundFunctionDecimal<short,duckdb::NumericHelper,duckdb::FloorDecimalOperator>;
    }
    else {
      __f = 
      GenericRoundFunctionDecimal<duckdb::hugeint_t,duckdb::Hugeint,duckdb::FloorDecimalOperator>;
    }
  }
  ::std::function<void(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&)>::operator=
            ((function<void(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&)> *)
             &bound_function->function,__f);
  pvVar6 = vector<duckdb::LogicalType,_true>::operator[]
                     (&(bound_function->super_BaseScalarFunction).super_SimpleFunction.arguments,0);
  if (pvVar6 != type) {
    pvVar6->id_ = (pEVar5->return_type).id_;
    pvVar6->physical_type_ = (pEVar5->return_type).physical_type_;
    shared_ptr<duckdb::ExtraTypeInfo,_true>::operator=
              (&pvVar6->type_info_,&(pEVar5->return_type).type_info_);
  }
  LogicalType::DECIMAL(in_stack_ffffffffffffff9e,in_stack_ffffffffffffff9d);
  _Var3._M_pi = local_60.type_info_.internal.
                super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                _M_pi;
  peVar2 = local_60.type_info_.internal.
           super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  (bound_function->super_BaseScalarFunction).return_type.id_ = local_60.id_;
  (bound_function->super_BaseScalarFunction).return_type.physical_type_ = local_60.physical_type_;
  uVar7 = *(undefined4 *)
           &(bound_function->super_BaseScalarFunction).return_type.type_info_.internal.
            super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  uVar8 = *(undefined4 *)
           ((long)&(bound_function->super_BaseScalarFunction).return_type.type_info_.internal.
                   super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr + 4)
  ;
  uVar9 = *(undefined4 *)
           &(bound_function->super_BaseScalarFunction).return_type.type_info_.internal.
            super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  uVar10 = *(undefined4 *)
            ((long)&(bound_function->super_BaseScalarFunction).return_type.type_info_.internal.
                    super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount._M_pi + 4);
  (bound_function->super_BaseScalarFunction).return_type.type_info_.internal.
  super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)0x0
  ;
  (bound_function->super_BaseScalarFunction).return_type.type_info_.internal.
  super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_60.type_info_.internal.super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>
  ._M_ptr = (element_type *)0x0;
  local_60.type_info_.internal.super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>
  ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  this_00 = (bound_function->super_BaseScalarFunction).return_type.type_info_.internal.
            super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  (bound_function->super_BaseScalarFunction).return_type.type_info_.internal.
  super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr = peVar2;
  (bound_function->super_BaseScalarFunction).return_type.type_info_.internal.
  super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       _Var3._M_pi;
  if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    local_48 = uVar7;
    uStack_44 = uVar8;
    uStack_40 = uVar9;
    uStack_3c = uVar10;
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
    uVar7 = local_48;
    uVar8 = uStack_44;
    uVar9 = uStack_40;
    uVar10 = uStack_3c;
  }
  _Var3._M_pi = local_60.type_info_.internal.
                super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                _M_pi;
  local_60.type_info_.internal.super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>
  ._M_ptr = (element_type *)CONCAT44(uVar8,uVar7);
  local_60.type_info_.internal.super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>
  ._M_refcount._M_pi._4_4_ = uVar10;
  local_60.type_info_.internal.super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>
  ._M_refcount._M_pi._0_4_ = uVar9;
  if (_Var3._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Var3._M_pi);
  }
  LogicalType::~LogicalType(&local_60);
  *(undefined8 *)this = 0;
  return (unique_ptr<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>_>)
         (unique_ptr<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>_>)this;
}

Assistant:

unique_ptr<FunctionData> BindGenericRoundFunctionDecimal(ClientContext &context, ScalarFunction &bound_function,
                                                         vector<unique_ptr<Expression>> &arguments) {
	// ceil essentially removes the scale
	auto &decimal_type = arguments[0]->return_type;
	auto scale = DecimalType::GetScale(decimal_type);
	auto width = DecimalType::GetWidth(decimal_type);
	if (scale == 0) {
		bound_function.function = ScalarFunction::NopFunction;
	} else {
		switch (decimal_type.InternalType()) {
		case PhysicalType::INT16:
			bound_function.function = GenericRoundFunctionDecimal<int16_t, NumericHelper, OP>;
			break;
		case PhysicalType::INT32:
			bound_function.function = GenericRoundFunctionDecimal<int32_t, NumericHelper, OP>;
			break;
		case PhysicalType::INT64:
			bound_function.function = GenericRoundFunctionDecimal<int64_t, NumericHelper, OP>;
			break;
		default:
			bound_function.function = GenericRoundFunctionDecimal<hugeint_t, Hugeint, OP>;
			break;
		}
	}
	bound_function.arguments[0] = decimal_type;
	bound_function.return_type = LogicalType::DECIMAL(width, 0);
	return nullptr;
}